

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

theme * theme_create(map *config_map)

{
  natwm_error nVar1;
  natwm_error err;
  theme *theme;
  map *config_map_local;
  
  config_map_local = (map *)malloc(0x20);
  if (config_map_local == (map *)0x0) {
    config_map_local = (map *)0x0;
  }
  else {
    nVar1 = border_theme_from_config
                      (config_map,"window.border_width",(border_theme **)config_map_local);
    if ((((nVar1 != NO_ERROR) ||
         (nVar1 = color_theme_from_config
                            (config_map,"window.border_color",
                             (color_theme **)&config_map_local->entries), nVar1 != NO_ERROR)) ||
        (nVar1 = color_value_from_config
                           (config_map,"resize.background_color",
                            (color_value **)&(config_map_local->mutex).__align), nVar1 != NO_ERROR))
       || (nVar1 = color_value_from_config
                             (config_map,"resize.border_color",
                              (color_value **)((long)&config_map_local->mutex + 8)),
          nVar1 != NO_ERROR)) {
      theme_destroy((theme *)config_map_local);
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to create theme");
      config_map_local = (map *)0x0;
    }
  }
  return (theme *)config_map_local;
}

Assistant:

struct theme *theme_create(const struct map *config_map)
{
        struct theme *theme = malloc(sizeof(struct theme));

        if (theme == NULL) {
                return NULL;
        }

        enum natwm_error err = GENERIC_ERROR;

        err = border_theme_from_config(
                config_map, WINDOW_BORDER_WIDTH_CONFIG_STRING, &theme->border_width);

        if (err != NO_ERROR) {
                goto handle_error;
        }

        err = color_theme_from_config(config_map, WINDOW_BORDER_COLOR_CONFIG_STRING, &theme->color);

        if (err != NO_ERROR) {
                goto handle_error;
        }

        err = color_value_from_config(
                config_map, RESIZE_BACKGROUND_COLOR_CONFIG_STRING, &theme->resize_background_color);

        if (err != NO_ERROR) {
                goto handle_error;
        }

        err = color_value_from_config(
                config_map, RESIZE_BORDER_COLOR_CONFIG_STRING, &theme->resize_border_color);

        if (err != NO_ERROR) {
                goto handle_error;
        }

        return theme;

handle_error:
        theme_destroy(theme);

        LOG_ERROR(natwm_logger, "Failed to create theme");

        return NULL;
}